

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::InspectInstrForMemSetCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemSetEmitData *emitData,bool *errorInInstr)

{
  code *pcVar1;
  bool bVar2;
  SymID SVar3;
  BailOutKind BVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  IndirOpnd *pIVar9;
  RegOpnd *pRVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  Instr *__instr__;
  char16 debugStringBuffer [42];
  MemSetCandidate *candidate;
  bool *errorInInstr_local;
  MemSetEmitData *emitData_local;
  Instr *instr_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  if (((emitData == (MemSetEmitData *)0x0) ||
      ((emitData->super_MemOpEmitData).candidate == (MemOpCandidate *)0x0)) ||
     (bVar2 = Loop::MemOpCandidate::IsMemSet((emitData->super_MemOpEmitData).candidate), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4456,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemSet())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemSet()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  unique0x00012000 = (emitData->super_MemOpEmitData).candidate;
  if ((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) {
    if (instr->m_opcode != LdElemI_A) {
      return false;
    }
    if ((DAT_01ec73ca & 1) != 0) {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar5,uVar6);
      if (!bVar2) {
        uVar5 = Func::GetSourceContextId(this->func);
        uVar6 = Func::GetLocalFunctionId(this->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar5,uVar6);
        if (!bVar2) goto LAB_005b5c4b;
      }
      Output::Print(L"TRACE MemSet:");
      pJVar12 = Func::GetJITFunctionBody(this->func);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
      uVar5 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar5);
      Output::Print(L"Orphan LdElemI_A detected");
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_005b5c4b:
    *errorInInstr = true;
    return false;
  }
  pOVar8 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar8);
  if (bVar2) {
    pOVar8 = IR::Instr::GetDst(instr);
    pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
    pRVar10 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
    pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
    SVar3 = GetVarSymID(this,pSVar11);
    if (SVar3 == stack0xffffffffffffffc0->base) {
      pOVar8 = IR::Instr::GetDst(instr);
      pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
      pRVar10 = IR::IndirOpnd::GetIndexOpnd(pIVar9);
      pSVar11 = IR::Opnd::GetStackSym(&pRVar10->super_Opnd);
      SVar3 = GetVarSymID(this,pSVar11);
      if (SVar3 == stack0xffffffffffffffc0->index) {
        bVar2 = IR::Instr::IsProfiledInstr(instr);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x445f,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        (emitData->super_MemOpEmitData).stElemInstr = instr;
        BVar4 = IR::Instr::GetBailOutKind(instr);
        (emitData->super_MemOpEmitData).bailOutKind = BVar4;
        return true;
      }
    }
  }
  if ((DAT_01ec73ca & 1) != 0) {
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar5,uVar6);
    if (!bVar2) {
      uVar5 = Func::GetSourceContextId(this->func);
      uVar6 = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar5,uVar6);
      if (!bVar2) goto LAB_005b5a82;
    }
    Output::Print(L"TRACE MemSet:");
    pJVar12 = Func::GetJITFunctionBody(this->func);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
    uVar5 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar5);
    Output::Print(L"Orphan StElemI_A detected");
    unique0x10000680 = instr;
    if (instr != (Instr *)0x0) {
      IR::Instr::DumpByteCodeOffset(instr);
    }
    if (stack0xffffffffffffff60 != (Instr *)0x0) {
      pcVar13 = Js::OpCodeUtil::GetOpCodeName(stack0xffffffffffffff60->m_opcode);
      Output::Print(L" (%s)",pcVar13);
    }
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_005b5a82:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemSetCandidate(Loop* loop, IR::Instr* instr, MemSetEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemSet());
    Loop::MemSetCandidate* candidate = (Loop::MemSetCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (instr->GetDst()->IsIndirOpnd()
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base)
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}